

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
::noshrink_reserve(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *this,size_t n)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  byte bVar4;
  ulong uVar5;
  float fVar6;
  arrays_type new_arrays_;
  
  if (n != 0) {
    fVar6 = ceilf((float)n / 0.875);
    uVar5 = (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
    uVar2 = uVar5 / 0xf;
    if (uVar2 == 0) {
      bVar4 = 0;
    }
    else {
      lVar1 = 0x3f;
      if (uVar2 != 0) {
        for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      bVar4 = (byte)lVar1 ^ 0x3f;
    }
    sVar3 = 0x1d;
    if (0x1d < uVar5) {
      sVar3 = (0xfL << (-bVar4 & 0x3f)) - 1;
    }
    uVar2 = (this->arrays).groups_size_mask * 0xf + 0xe;
    if ((this->arrays).elements_ == (value_type_pointer)0x0) {
      uVar2 = 0;
    }
    if (uVar2 < sVar3) {
      new_arrays(&new_arrays_,this,sVar3);
      delete_arrays(this,&this->arrays);
      (this->arrays).groups_ = new_arrays_.groups_;
      (this->arrays).elements_ = new_arrays_.elements_;
      (this->arrays).groups_size_index = new_arrays_.groups_size_index;
      (this->arrays).groups_size_mask = new_arrays_.groups_size_mask;
      sVar3 = initial_max_load(this);
      (this->size_ctrl).ml = sVar3;
    }
  }
  return;
}

Assistant:

void noshrink_reserve(std::size_t n) {
        /* used only on assignment after element clearance */
        BOOST_ASSERT(empty());

        if (n) {
            n = std::size_t(std::ceil(float(n) / mlf));
            n = capacity_for(n);

            if (n > capacity()) {
                auto new_arrays_ = new_arrays(n);
                delete_arrays(arrays);
                arrays = new_arrays_;
                size_ctrl.ml = initial_max_load();
            }
        }
    }